

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O2

void Llb_ManFlowCollectAndMarkCone(Aig_Man_t *p,Vec_Ptr_t *vStarts,Vec_Ptr_t *vCone)

{
  Aig_Obj_t *pObj;
  int i;
  
  vCone->nSize = 0;
  i = 0;
  while( true ) {
    if (vStarts->nSize <= i) {
      return;
    }
    pObj = (Aig_Obj_t *)Vec_PtrEntry(vStarts,i);
    if ((*(uint *)&pObj->field_0x18 & 0x30) != 0x10) break;
    Llb_ManFlowCollectAndMarkCone_rec(p,pObj,vCone);
    i = i + 1;
  }
  __assert_fail("pObj->fMarkA && !pObj->fMarkB",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Flow.c"
                ,0x420,"void Llb_ManFlowCollectAndMarkCone(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
}

Assistant:

void Llb_ManFlowCollectAndMarkCone( Aig_Man_t * p, Vec_Ptr_t * vStarts, Vec_Ptr_t * vCone )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrClear( vCone );
    Vec_PtrForEachEntry( Aig_Obj_t *, vStarts, pObj, i )
    {
        assert( pObj->fMarkA && !pObj->fMarkB );
        Llb_ManFlowCollectAndMarkCone_rec( p, pObj, vCone );
    }
}